

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O1

bool ON_WildCardMatch(char *s,char *pattern)

{
  char *pcVar1;
  char cVar2;
  bool bVar3;
  
LAB_005c154e:
  if ((pattern == (char *)0x0) || (*pattern == '\0')) {
    if (s == (char *)0x0) {
LAB_005c15e7:
      bVar3 = true;
    }
    else {
      bVar3 = *s == '\0';
    }
  }
  else {
    if (*pattern != '*') {
      do {
        cVar2 = *pattern;
        if (cVar2 == '?') {
          if (*s == '\0') goto LAB_005c15d6;
        }
        else {
          if (cVar2 == '\\') {
            if ((pattern[1] == '?') || (pattern[1] == '*')) {
              pattern = pattern + 1;
            }
          }
          else if (cVar2 == '*') goto LAB_005c154e;
          if (*pattern != *s) goto LAB_005c15d6;
          if (*s == '\0') goto LAB_005c15e7;
        }
        pattern = pattern + 1;
        s = s + 1;
      } while( true );
    }
    do {
      pcVar1 = pattern + 1;
      pattern = pattern + 1;
    } while (*pcVar1 == '*');
    if (*pcVar1 == '\0') goto LAB_005c15e7;
    if (*s == '\0') {
LAB_005c15d6:
      bVar3 = false;
    }
    else {
      while (bVar3 = ON_WildCardMatch(s,pattern), !bVar3) {
        pcVar1 = s + 1;
        s = s + 1;
        if (*pcVar1 == '\0') {
          return bVar3;
        }
      }
    }
  }
  return bVar3;
}

Assistant:

bool ON_WildCardMatch(const char* s, const char* pattern)
{
  if ( !pattern || !pattern[0] ) {
    return ( !s || !s[0] ) ? true : false;
  }

  if ( *pattern == '*' ) {
    pattern++;
    while ( *pattern == '*' )
      pattern++;
    
    if ( !pattern[0] )
      return true;

    while (*s) {
      if ( ON_WildCardMatch(s,pattern) )
        return true;
      s++;
    }

    return false;
  }

  while ( *pattern != '*' )
  {
    if ( *pattern == '?' ) {
      if ( *s) {
        pattern++;
        s++;
        continue;
      }
      return false;
    }
    
    if ( *pattern == '\\' ) {
      switch( pattern[1] )
      {
      case '*':
      case '?':
        pattern++;
        break;
      }
    }
    if ( *pattern != *s ) {
      return false;
    }

    if ( *s == 0 )
      return true;

    pattern++;
    s++;
  }
  
  return ON_WildCardMatch(s,pattern);
}